

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::ProcessCacheArg(cmake *this,string *var,string *value,CacheEntryType type)

{
  int iVar1;
  cmValue cVar2;
  string *psVar3;
  bool bVar4;
  string cachedValue;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50 [2];
  long local_40 [2];
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  if (this->WarnUnusedCli == true) {
    cVar2 = cmState::GetInitializedCacheValue
                      ((this->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,var);
    bVar4 = cVar2.Value != (string *)0x0;
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&local_70);
    }
  }
  else {
    bVar4 = false;
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"No help, variable specified on the command line.","");
  AddCacheEntry(this,var,(cmValue)value,(string *)local_50,type);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (this->WarnUnusedCli != true) goto LAB_002664db;
  if (bVar4) {
    psVar3 = (string *)
             cmState::GetInitializedCacheValue
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl,var);
    if (psVar3 == (string *)0x0) {
      psVar3 = &cmValue::Empty_abi_cxx11_;
    }
    if (local_68 == psVar3->_M_string_length) {
      if (local_68 == 0) goto LAB_002664db;
      iVar1 = bcmp(local_70,(psVar3->_M_dataplus)._M_p,local_68);
      if (iVar1 == 0) goto LAB_002664db;
    }
  }
  WatchUnusedCli(this,var);
LAB_002664db:
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void cmake::ProcessCacheArg(const std::string& var, const std::string& value,
                            cmStateEnums::CacheEntryType type)
{
  // The value is transformed if it is a filepath for example, so
  // we can't compare whether the value is already in the cache until
  // after we call AddCacheEntry.
  bool haveValue = false;
  std::string cachedValue;
  if (this->WarnUnusedCli) {
    if (cmValue v = this->State->GetInitializedCacheValue(var)) {
      haveValue = true;
      cachedValue = *v;
    }
  }

  this->AddCacheEntry(
    var, value, "No help, variable specified on the command line.", type);

  if (this->WarnUnusedCli) {
    if (!haveValue ||
        cachedValue != *this->State->GetInitializedCacheValue(var)) {
      this->WatchUnusedCli(var);
    }
  }
}